

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O2

QRect __thiscall QWidgetPrivate::effectiveRectFor(QWidgetPrivate *this,QRect *rect)

{
  QGraphicsEffect *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QRectF local_60;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->graphicsEffect != (QGraphicsEffect *)0x0) {
    bVar2 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if (bVar2) {
      pQVar1 = this->graphicsEffect;
      QRectF::QRectF(&local_60,rect);
      (**(code **)(*(long *)pQVar1 + 0x60))(local_40,pQVar1,&local_60);
      QVar3 = (QRect)QRectF::toAlignedRect();
      goto LAB_003055de;
    }
  }
  QVar3 = *rect;
LAB_003055de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline QRect effectiveRectFor(const QRect &rect) const
    {
#if QT_CONFIG(graphicseffect)
        if (graphicsEffect && graphicsEffect->isEnabled())
            return graphicsEffect->boundingRectFor(rect).toAlignedRect();
#endif // QT_CONFIG(graphicseffect)
        return rect;
    }